

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::prepareQueries(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLuint *pGVar3;
  undefined4 *puVar4;
  long lVar5;
  ulong uVar6;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  pGVar3 = (GLuint *)operator_new__(0x10);
  this->m_qo = pGVar3;
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    if (uVar6 == 4) {
      return;
    }
    (**(code **)(lVar2 + 0x3d8))
              (*(undefined4 *)((long)&s_targets + lVar5),1,(long)this->m_qo + lVar5);
    iVar1 = (**(code **)(lVar2 + 0x800))();
    if (iVar1 != 0) break;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 4;
  }
  if (uVar6 != 0) {
    (**(code **)(lVar2 + 0x458))(uVar6 & 0xffffffff,this->m_qo);
  }
  if (this->m_qo != (GLuint *)0x0) {
    operator_delete__(this->m_qo);
  }
  this->m_qo = (GLuint *)0x0;
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::prepareQueries()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Allocating memory for queries array. */
	m_qo = new glw::GLuint[s_targets_count];

	if (DE_NULL == m_qo)
	{
		throw 0;
	}

	/* Creating query object for each target. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		gl.createQueries(s_targets[i], 1, &m_qo[i]);

		/* Error checking. */
		if (GL_NO_ERROR != gl.getError())
		{
			/* Remove previous. */
			if (i > 0)
			{
				gl.deleteQueries(i, m_qo);
			}

			/* Deallocate storage. */
			delete[] m_qo;

			m_qo = DE_NULL;

			/* Signalise test failure. */
			throw 0;
		}
	}
}